

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
::push_back(vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
            *this,BilinearPatchMesh **value)

{
  BilinearPatchMesh **in_RSI;
  polymorphic_allocator<pbrt::BilinearPatchMesh_const*> *in_RDI;
  vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
  *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x10) == *(long *)(in_RDI + 0x18)) {
    reserve(unaff_retaddr,(size_t)in_RDI);
  }
  pmr::polymorphic_allocator<pbrt::BilinearPatchMesh_const*>::
  construct<pbrt::BilinearPatchMesh_const*,pbrt::BilinearPatchMesh_const*const&>
            (in_RDI,(BilinearPatchMesh **)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x18) * 8),
             in_RSI);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  return;
}

Assistant:

void push_back(const T &value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, value);
        ++nStored;
    }